

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

string * __thiscall
wabt::(anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view module_name)

{
  string local_30;
  
  MangleModuleName_abi_cxx11_(&local_30,this,module_name);
  std::operator+(__return_storage_ptr__,"w2c_",&local_30);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::ModuleInstanceTypeName(std::string_view module_name) {
  return kGlobalSymbolPrefix + MangleModuleName(module_name);
}